

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O3

uint * fetchTransformedBilinearARGB32PM<(TextureBlendType)4>
                 (uint *buffer,Operator *param_2,QSpanData *data,int y,int x,int length)

{
  uint *puVar1;
  double dVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uchar *puVar7;
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  unkuint9 Var67;
  undefined1 auVar68 [15];
  undefined1 auVar69 [13];
  undefined1 auVar70 [15];
  unkuint9 Var71;
  undefined1 auVar72 [15];
  undefined1 auVar73 [13];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [13];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [13];
  undefined1 auVar80 [15];
  undefined1 auVar81 [11];
  undefined1 auVar82 [15];
  undefined1 auVar83 [11];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [15];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  uint *puVar98;
  uint *puVar99;
  int iVar100;
  uint unaff_EBP;
  int iVar101;
  uint uVar102;
  uint uVar103;
  uint uVar104;
  long lVar105;
  int iVar106;
  uint *puVar107;
  long lVar108;
  long lVar109;
  long in_FS_OFFSET;
  ulong uVar110;
  short sVar111;
  short sVar114;
  double dVar112;
  double dVar113;
  short sVar115;
  short sVar118;
  double dVar116;
  double dVar117;
  int iVar119;
  double dVar120;
  byte bVar123;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  double dVar124;
  double dVar125;
  ulong uVar126;
  byte bVar139;
  undefined1 auVar127 [12];
  double dVar140;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar128 [12];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined4 uVar141;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  int iVar146;
  int iVar150;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar151 [12];
  undefined1 auVar152 [16];
  int iVar154;
  int iVar156;
  undefined1 auVar155 [16];
  double dVar157;
  double dVar158;
  uint local_e8;
  uint local_40;
  uint local_3c;
  long local_38;
  undefined1 auVar131 [16];
  undefined1 auVar142 [12];
  undefined1 auVar143 [16];
  undefined1 auVar153 [16];
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  dVar116 = (double)x + 0.5;
  dVar124 = (double)y + 0.5;
  puVar1 = buffer + length;
  if ((data->field_0x8a & 1) == 0) {
    dVar157 = data->m11;
    dVar158 = data->m12;
  }
  else {
    dVar157 = data->m11;
    dVar158 = data->m12;
    dVar2 = data->m22;
    dVar125 = (dVar124 * data->m21 + dVar116 * dVar157 + data->dx) * 65536.0;
    dVar140 = (dVar124 * dVar2 + dVar116 * dVar158 + data->dy) * 65536.0;
    dVar117 = dVar140;
    if (dVar125 <= dVar140) {
      dVar117 = dVar125;
    }
    dVar112 = trunc(dVar157 * 65536.0);
    dVar113 = trunc(dVar158 * 65536.0);
    dVar120 = (double)length * dVar112 + dVar125;
    dVar113 = (double)length * dVar113 + dVar140;
    dVar112 = dVar113;
    if (dVar120 <= dVar113) {
      dVar112 = dVar120;
    }
    if (dVar117 <= dVar112) {
      dVar112 = dVar117;
    }
    if (-2147483648.0 <= dVar112) {
      dVar117 = dVar140;
      if (dVar140 <= dVar125) {
        dVar117 = dVar125;
      }
      if (dVar113 <= dVar120) {
        dVar113 = dVar120;
      }
      if (dVar113 <= dVar117) {
        dVar113 = dVar117;
      }
      if (dVar113 <= 2147483647.0) {
        uVar103 = (uint)(dVar157 * 65536.0);
        iVar119 = (int)(dVar158 * 65536.0);
        local_3c = (int)dVar125 - 0x8000;
        local_40 = (int)dVar140 - 0x8000;
        if (iVar119 != 0) {
          uVar110 = -(ulong)(dVar157 < -dVar157);
          if (((double)(~uVar110 & (ulong)dVar157 | (ulong)-dVar157 & uVar110) < 0.125) ||
             (uVar110 = -(ulong)(dVar2 < -dVar2),
             (double)(~uVar110 & (ulong)dVar2 | (ulong)-dVar2 & uVar110) < 0.125)) {
            if (0 < length) {
              puVar7 = (data->field_23).texture.imageData;
              lVar105 = (data->field_23).texture.bytesPerLine;
              puVar98 = buffer;
              do {
                uVar102 = local_3c >> 8 & 0xff;
                uVar104 = local_40 >> 8 & 0xff;
                iVar156 = (int)local_3c >> 0x10;
                iVar146 = (int)local_40 >> 0x10;
                iVar101 = (data->field_23).texture.x2 + -1;
                iVar100 = iVar156 + 1;
                if (iVar101 <= iVar156) {
                  iVar100 = iVar101;
                }
                iVar150 = (data->field_23).texture.x1;
                if (iVar156 < iVar101) {
                  iVar101 = iVar156;
                }
                iVar154 = (data->field_23).texture.y1;
                if (iVar156 < iVar150) {
                  iVar100 = iVar150;
                  iVar101 = iVar150;
                }
                iVar156 = (data->field_23).texture.y2 + -1;
                iVar150 = iVar156;
                if (iVar146 < iVar156) {
                  iVar156 = iVar146;
                  iVar150 = iVar146 + 1;
                }
                if (iVar146 < iVar154) {
                  iVar156 = iVar154;
                  iVar150 = iVar154;
                }
                lVar109 = iVar150 * lVar105;
                lVar108 = iVar156 * lVar105;
                uVar141 = *(undefined4 *)(puVar7 + (long)iVar100 * 4 + lVar108);
                uVar4 = *(undefined4 *)(puVar7 + (long)iVar101 * 4 + lVar108);
                uVar5 = *(undefined4 *)(puVar7 + (long)iVar100 * 4 + lVar109);
                uVar126 = CONCAT44(uVar141,uVar4);
                uVar6 = *(undefined4 *)(puVar7 + (long)iVar101 * 4 + lVar109);
                uVar110 = CONCAT44(uVar5,uVar6);
                bVar123 = (byte)((uint)uVar5 >> 0x18);
                auVar40._8_6_ = 0;
                auVar40._0_8_ = uVar110;
                auVar40[0xe] = bVar123;
                auVar44._8_4_ = 0;
                auVar44._0_8_ = uVar110;
                auVar44[0xc] = (char)((uint)uVar5 >> 0x10);
                auVar44._13_2_ = auVar40._13_2_;
                auVar48._8_4_ = 0;
                auVar48._0_8_ = uVar110;
                auVar48._12_3_ = auVar44._12_3_;
                auVar52._8_2_ = 0;
                auVar52._0_8_ = uVar110;
                auVar52[10] = (char)((uint)uVar5 >> 8);
                auVar52._11_4_ = auVar48._11_4_;
                auVar56._8_2_ = 0;
                auVar56._0_8_ = uVar110;
                auVar56._10_5_ = auVar52._10_5_;
                auVar60[8] = (char)uVar5;
                auVar60._0_8_ = uVar110;
                auVar60._9_6_ = auVar56._9_6_;
                auVar74._7_8_ = 0;
                auVar74._0_7_ = auVar60._8_7_;
                Var67 = CONCAT81(SUB158(auVar74 << 0x40,7),(char)((uint)uVar6 >> 0x18));
                auVar90._9_6_ = 0;
                auVar90._0_9_ = Var67;
                auVar64[4] = (char)((uint)uVar6 >> 0x10);
                auVar64._0_4_ = uVar6;
                auVar64._5_10_ = SUB1510(auVar90 << 0x30,5);
                auVar75._11_4_ = 0;
                auVar75._0_11_ = auVar64._4_11_;
                auVar76._1_12_ = SUB1512(auVar75 << 0x20,3);
                auVar76[0] = (char)((uint)uVar6 >> 8);
                auVar144 = pshuflw(ZEXT416(0x100 - uVar104),ZEXT416(0x100 - uVar104),0);
                bVar139 = (byte)((uint)uVar141 >> 0x18);
                auVar41._8_6_ = 0;
                auVar41._0_8_ = uVar126;
                auVar41[0xe] = bVar139;
                auVar45._8_4_ = 0;
                auVar45._0_8_ = uVar126;
                auVar45[0xc] = (char)((uint)uVar141 >> 0x10);
                auVar45._13_2_ = auVar41._13_2_;
                auVar49._8_4_ = 0;
                auVar49._0_8_ = uVar126;
                auVar49._12_3_ = auVar45._12_3_;
                auVar53._8_2_ = 0;
                auVar53._0_8_ = uVar126;
                auVar53[10] = (char)((uint)uVar141 >> 8);
                auVar53._11_4_ = auVar49._11_4_;
                auVar57._8_2_ = 0;
                auVar57._0_8_ = uVar126;
                auVar57._10_5_ = auVar53._10_5_;
                auVar61[8] = (char)uVar141;
                auVar61._0_8_ = uVar126;
                auVar61._9_6_ = auVar57._9_6_;
                auVar77._7_8_ = 0;
                auVar77._0_7_ = auVar61._8_7_;
                Var71 = CONCAT81(SUB158(auVar77 << 0x40,7),(char)((uint)uVar4 >> 0x18));
                auVar91._9_6_ = 0;
                auVar91._0_9_ = Var71;
                auVar65[4] = (char)((uint)uVar4 >> 0x10);
                auVar65._0_4_ = uVar4;
                auVar65._5_10_ = SUB1510(auVar91 << 0x30,5);
                auVar78._11_4_ = 0;
                auVar78._0_11_ = auVar65._4_11_;
                auVar79._1_12_ = SUB1512(auVar78 << 0x20,3);
                auVar79[0] = (char)((uint)uVar4 >> 8);
                auVar152 = pshuflw(ZEXT416(uVar104),ZEXT416(uVar104),0);
                sVar115 = auVar144._0_2_;
                sVar118 = auVar144._2_2_;
                sVar111 = auVar152._0_2_;
                sVar114 = auVar152._2_2_;
                auVar133._0_4_ =
                     CONCAT22(sVar114 * auVar76._0_2_ + sVar118 * auVar79._0_2_,
                              sVar111 * (ushort)(byte)uVar6 + sVar115 * (ushort)(byte)uVar4);
                auVar127._0_8_ =
                     CONCAT26(sVar114 * (short)Var67 + sVar118 * (short)Var71,
                              CONCAT24(sVar111 * auVar64._4_2_ + sVar115 * auVar65._4_2_,
                                       auVar133._0_4_));
                auVar127._8_2_ = sVar111 * auVar60._8_2_ + sVar115 * auVar61._8_2_;
                auVar127._10_2_ = sVar114 * auVar52._10_2_ + sVar118 * auVar53._10_2_;
                auVar152._12_2_ = sVar111 * auVar44._12_2_ + sVar115 * auVar45._12_2_;
                auVar152._0_12_ = auVar127;
                auVar152._14_2_ = sVar114 * (ushort)bVar123 + sVar118 * (ushort)bVar139;
                auVar144._0_4_ = CONCAT22((short)uVar102,(short)(0x100 - uVar102));
                auVar133._12_4_ = auVar152._12_4_;
                auVar133._4_4_ = auVar127._8_4_;
                auVar133._8_4_ = (int)((ulong)auVar127._0_8_ >> 0x20);
                auVar152 = pshuflw(auVar133,auVar133,0xd8);
                auVar152 = pshufhw(auVar152,auVar152,0xd8);
                auVar144._4_4_ = auVar144._0_4_;
                auVar144._8_4_ = auVar144._0_4_;
                auVar144._12_4_ = auVar144._0_4_;
                auVar129._0_2_ = auVar152._0_2_ >> 8;
                auVar129._2_2_ = auVar152._2_2_ >> 8;
                auVar129._4_2_ = auVar152._4_2_ >> 8;
                auVar129._6_2_ = auVar152._6_2_ >> 8;
                auVar129._8_2_ = auVar152._8_2_ >> 8;
                auVar129._10_2_ = auVar152._10_2_ >> 8;
                auVar129._12_2_ = auVar152._12_2_ >> 8;
                auVar129._14_2_ = auVar152._14_2_ >> 8;
                auVar144 = pmaddwd(auVar129,auVar144);
                auVar130._0_4_ = auVar144._0_4_ >> 8;
                auVar130._4_4_ = auVar144._4_4_ >> 8;
                auVar130._8_4_ = auVar144._8_4_ >> 8;
                auVar130._12_4_ = auVar144._12_4_ >> 8;
                auVar144 = packssdw(auVar130,auVar130);
                sVar111 = auVar144._0_2_;
                sVar114 = auVar144._2_2_;
                sVar115 = auVar144._4_2_;
                sVar118 = auVar144._6_2_;
                local_3c = local_3c + uVar103;
                local_40 = local_40 + iVar119;
                *puVar98 = CONCAT13((0 < sVar118) * (sVar118 < 0x100) * auVar144[6] -
                                    (0xff < sVar118),
                                    CONCAT12((0 < sVar115) * (sVar115 < 0x100) * auVar144[4] -
                                             (0xff < sVar115),
                                             CONCAT11((0 < sVar114) * (sVar114 < 0x100) *
                                                      auVar144[2] - (0xff < sVar114),
                                                      (0 < sVar111) * (sVar111 < 0x100) *
                                                      auVar144[0] - (0xff < sVar111))));
                puVar98 = puVar98 + 1;
              } while (puVar98 < puVar1);
            }
          }
          else {
            (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_4)
                      (buffer,puVar1,&data->field_23,&local_3c,&local_40,uVar103,iVar119);
          }
          goto LAB_00658fb5;
        }
        uVar102 = -uVar103;
        if (0 < (int)uVar103) {
          uVar102 = uVar103;
        }
        puVar98 = buffer;
        if (0x10000 < uVar102) {
          if (0x20000 < uVar102) {
            uVar110 = -(ulong)(dVar2 < -dVar2);
            if (0.125 <= (double)(~uVar110 & (ulong)dVar2 | (ulong)-dVar2 & uVar110)) {
              (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_2)
                        (buffer,puVar1,&data->field_23,&local_3c,&local_40,uVar103,0);
              goto LAB_00658fb5;
            }
            uVar102 = local_40 >> 8 & 0xff;
            iVar156 = (int)local_40 >> 0x10;
            iVar119 = (data->field_23).texture.y1;
            iVar101 = (data->field_23).texture.y2 + -1;
            iVar100 = iVar101;
            if (iVar156 < iVar101) {
              iVar101 = iVar156;
              iVar100 = iVar156 + 1;
            }
            if (iVar156 < iVar119) {
              iVar100 = iVar119;
              iVar101 = iVar119;
            }
            puVar7 = (data->field_23).texture.imageData;
            lVar105 = (data->field_23).texture.bytesPerLine;
            lVar108 = iVar101 * lVar105;
            lVar105 = iVar100 * lVar105;
            iVar119 = (data->field_23).texture.x1;
            iVar101 = (data->field_23).texture.x2;
            local_e8 = local_40 >> 8 & 0xff;
            puVar107 = buffer;
            if (0 < length) {
              do {
                iVar100 = (data->field_23).texture.x1;
                if ((iVar100 <= (int)local_3c >> 0x10) &&
                   (iVar100 = (data->field_23).texture.x2 + -1, (int)local_3c >> 0x10 < iVar100))
                break;
                uVar110 = (((ulong)*(uint *)(puVar7 + (long)iVar100 * 4 + lVar105) << 0x18 |
                           (ulong)*(uint *)(puVar7 + (long)iVar100 * 4 + lVar105)) &
                          0xff00ff00ff00ff) * (ulong)uVar102 +
                          (((ulong)*(uint *)(puVar7 + (long)iVar100 * 4 + lVar108) << 0x18 |
                           (ulong)*(uint *)(puVar7 + (long)iVar100 * 4 + lVar108)) &
                          0xff00ff00ff00ff) * (ulong)(0x100 - uVar102) >> 8 & 0xff00ff00ff00ff;
                *puVar107 = (uint)(uVar110 >> 0x18) | (uint)uVar110;
                local_3c = local_3c + uVar103;
                puVar107 = puVar107 + 1;
              } while (puVar107 < puVar1);
            }
            if ((int)uVar103 < 1) {
              puVar99 = puVar1;
              if ((int)uVar103 < 0) {
                lVar109 = (long)iVar119 * 0x10000 - (long)(int)local_3c;
                uVar110 = (ulong)(int)uVar103;
                goto LAB_00659497;
              }
            }
            else {
              lVar109 = ((long)iVar101 * 0x10000 + -0x10000) - (long)(int)local_3c;
              uVar110 = (ulong)uVar103;
LAB_00659497:
              puVar99 = puVar107 + lVar109 / (long)uVar110;
              if (puVar1 < puVar107 + lVar109 / (long)uVar110) {
                puVar99 = puVar1;
              }
            }
            if (puVar107 < puVar99) {
              auVar144 = pshuflw(ZEXT416(0x100 - local_e8),ZEXT416(0x100 - local_e8),0);
              auVar152 = pshuflw(ZEXT416(local_e8),ZEXT416(local_e8),0);
              do {
                uVar102 = local_3c >> 8 & 0xff;
                uVar110 = *(ulong *)(puVar7 + (long)((int)local_3c >> 0x10) * 4 + lVar108);
                uVar126 = *(ulong *)(puVar7 + (long)((int)local_3c >> 0x10) * 4 + lVar105);
                auVar8._8_6_ = 0;
                auVar8._0_8_ = uVar110;
                auVar8[0xe] = (char)(uVar110 >> 0x38);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar110;
                auVar12[0xc] = (char)(uVar110 >> 0x30);
                auVar12._13_2_ = auVar8._13_2_;
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar110;
                auVar16._12_3_ = auVar12._12_3_;
                auVar20._8_2_ = 0;
                auVar20._0_8_ = uVar110;
                auVar20[10] = (char)(uVar110 >> 0x28);
                auVar20._11_4_ = auVar16._11_4_;
                auVar24._8_2_ = 0;
                auVar24._0_8_ = uVar110;
                auVar24._10_5_ = auVar20._10_5_;
                auVar28[8] = (char)(uVar110 >> 0x20);
                auVar28._0_8_ = uVar110;
                auVar28._9_6_ = auVar24._9_6_;
                auVar80._7_8_ = 0;
                auVar80._0_7_ = auVar28._8_7_;
                Var67 = CONCAT81(SUB158(auVar80 << 0x40,7),(char)(uVar110 >> 0x18));
                auVar92._9_6_ = 0;
                auVar92._0_9_ = Var67;
                auVar81._1_10_ = SUB1510(auVar92 << 0x30,5);
                auVar81[0] = (char)(uVar110 >> 0x10);
                auVar93._11_4_ = 0;
                auVar93._0_11_ = auVar81;
                auVar34[2] = (char)(uVar110 >> 8);
                auVar34._0_2_ = (ushort)uVar110;
                auVar34._3_12_ = SUB1512(auVar93 << 0x20,3);
                sVar111 = auVar144._0_2_;
                sVar114 = auVar144._2_2_;
                auVar9._8_6_ = 0;
                auVar9._0_8_ = uVar126;
                auVar9[0xe] = (char)(uVar126 >> 0x38);
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar126;
                auVar13[0xc] = (char)(uVar126 >> 0x30);
                auVar13._13_2_ = auVar9._13_2_;
                auVar17._8_4_ = 0;
                auVar17._0_8_ = uVar126;
                auVar17._12_3_ = auVar13._12_3_;
                auVar21._8_2_ = 0;
                auVar21._0_8_ = uVar126;
                auVar21[10] = (char)(uVar126 >> 0x28);
                auVar21._11_4_ = auVar17._11_4_;
                auVar25._8_2_ = 0;
                auVar25._0_8_ = uVar126;
                auVar25._10_5_ = auVar21._10_5_;
                auVar29[8] = (char)(uVar126 >> 0x20);
                auVar29._0_8_ = uVar126;
                auVar29._9_6_ = auVar25._9_6_;
                auVar82._7_8_ = 0;
                auVar82._0_7_ = auVar29._8_7_;
                Var71 = CONCAT81(SUB158(auVar82 << 0x40,7),(char)(uVar126 >> 0x18));
                auVar94._9_6_ = 0;
                auVar94._0_9_ = Var71;
                auVar83._1_10_ = SUB1510(auVar94 << 0x30,5);
                auVar83[0] = (char)(uVar126 >> 0x10);
                auVar95._11_4_ = 0;
                auVar95._0_11_ = auVar83;
                auVar35[2] = (char)(uVar126 >> 8);
                auVar35._0_2_ = (ushort)uVar126;
                auVar35._3_12_ = SUB1512(auVar95 << 0x20,3);
                sVar115 = auVar152._0_2_;
                sVar118 = auVar152._2_2_;
                auVar132._0_4_ =
                     CONCAT22(auVar35._2_2_ * sVar118 + auVar34._2_2_ * sVar114,
                              ((ushort)uVar126 & 0xff) * sVar115 +
                              ((ushort)uVar110 & 0xff) * sVar111);
                auVar128._0_8_ =
                     CONCAT26((short)Var71 * sVar118 + (short)Var67 * sVar114,
                              CONCAT24(auVar83._0_2_ * sVar115 + auVar81._0_2_ * sVar111,
                                       auVar132._0_4_));
                auVar128._8_2_ = auVar29._8_2_ * sVar115 + auVar28._8_2_ * sVar111;
                auVar128._10_2_ = auVar21._10_2_ * sVar118 + auVar20._10_2_ * sVar114;
                auVar131._12_2_ = auVar13._12_2_ * sVar115 + auVar12._12_2_ * sVar111;
                auVar131._0_12_ = auVar128;
                auVar131._14_2_ = (auVar9._13_2_ >> 8) * sVar118 + (auVar8._13_2_ >> 8) * sVar114;
                auVar121._0_4_ = CONCAT22((short)uVar102,(short)(0x100 - uVar102));
                auVar121._4_4_ = auVar121._0_4_;
                auVar121._8_4_ = auVar121._0_4_;
                auVar121._12_4_ = auVar121._0_4_;
                auVar132._12_4_ = auVar131._12_4_;
                auVar132._4_4_ = auVar128._8_4_;
                auVar132._8_4_ = (int)((ulong)auVar128._0_8_ >> 0x20);
                auVar133 = pshuflw(auVar132,auVar132,0xd8);
                auVar133 = pshufhw(auVar133,auVar133,0xd8);
                auVar134._0_2_ = auVar133._0_2_ >> 8;
                auVar134._2_2_ = auVar133._2_2_ >> 8;
                auVar134._4_2_ = auVar133._4_2_ >> 8;
                auVar134._6_2_ = auVar133._6_2_ >> 8;
                auVar134._8_2_ = auVar133._8_2_ >> 8;
                auVar134._10_2_ = auVar133._10_2_ >> 8;
                auVar134._12_2_ = auVar133._12_2_ >> 8;
                auVar134._14_2_ = auVar133._14_2_ >> 8;
                auVar133 = pmaddwd(auVar134,auVar121);
                auVar135._0_4_ = auVar133._0_4_ >> 8;
                auVar135._4_4_ = auVar133._4_4_ >> 8;
                auVar135._8_4_ = auVar133._8_4_ >> 8;
                auVar135._12_4_ = auVar133._12_4_ >> 8;
                auVar133 = packssdw(auVar135,auVar135);
                sVar111 = auVar133._0_2_;
                sVar114 = auVar133._2_2_;
                sVar115 = auVar133._4_2_;
                sVar118 = auVar133._6_2_;
                *puVar107 = CONCAT13((0 < sVar118) * (sVar118 < 0x100) * auVar133[6] -
                                     (0xff < sVar118),
                                     CONCAT12((0 < sVar115) * (sVar115 < 0x100) * auVar133[4] -
                                              (0xff < sVar115),
                                              CONCAT11((0 < sVar114) * (sVar114 < 0x100) *
                                                       auVar133[2] - (0xff < sVar114),
                                                       (0 < sVar111) * (sVar111 < 0x100) *
                                                       auVar133[0] - (0xff < sVar111))));
                local_3c = local_3c + uVar103;
                puVar107 = puVar107 + 1;
              } while (puVar107 < puVar99);
            }
            if (puVar107 < puVar1) {
              auVar144 = pshuflw(ZEXT416(0x100 - local_e8),ZEXT416(0x100 - local_e8),0);
              auVar152 = pshuflw(ZEXT416(local_e8),ZEXT416(local_e8),0);
              do {
                iVar100 = (int)local_3c >> 0x10;
                iVar119 = (data->field_23).texture.x2 + -1;
                iVar101 = iVar119;
                if (iVar100 < iVar119) {
                  iVar119 = iVar100;
                  iVar101 = iVar100 + 1;
                }
                iVar156 = (data->field_23).texture.x1;
                if (iVar100 < iVar156) {
                  iVar119 = iVar156;
                }
                uVar102 = local_3c >> 8 & 0xff;
                if (iVar100 < iVar156) {
                  iVar101 = iVar156;
                }
                uVar141 = *(undefined4 *)(puVar7 + (long)iVar101 * 4 + lVar108);
                uVar4 = *(undefined4 *)(puVar7 + (long)iVar119 * 4 + lVar108);
                uVar110 = CONCAT44(uVar141,uVar4);
                uVar5 = *(undefined4 *)(puVar7 + (long)iVar101 * 4 + lVar105);
                uVar6 = *(undefined4 *)(puVar7 + (long)iVar119 * 4 + lVar105);
                uVar126 = CONCAT44(uVar5,uVar6);
                auVar10._8_6_ = 0;
                auVar10._0_8_ = uVar110;
                auVar10[0xe] = (char)((uint)uVar141 >> 0x18);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar110;
                auVar14[0xc] = (char)((uint)uVar141 >> 0x10);
                auVar14._13_2_ = auVar10._13_2_;
                auVar18._8_4_ = 0;
                auVar18._0_8_ = uVar110;
                auVar18._12_3_ = auVar14._12_3_;
                auVar22._8_2_ = 0;
                auVar22._0_8_ = uVar110;
                auVar22[10] = (char)((uint)uVar141 >> 8);
                auVar22._11_4_ = auVar18._11_4_;
                auVar26._8_2_ = 0;
                auVar26._0_8_ = uVar110;
                auVar26._10_5_ = auVar22._10_5_;
                auVar30[8] = (char)uVar141;
                auVar30._0_8_ = uVar110;
                auVar30._9_6_ = auVar26._9_6_;
                auVar84._7_8_ = 0;
                auVar84._0_7_ = auVar30._8_7_;
                Var67 = CONCAT81(SUB158(auVar84 << 0x40,7),(char)((uint)uVar4 >> 0x18));
                auVar96._9_6_ = 0;
                auVar96._0_9_ = Var67;
                auVar32[4] = (char)((uint)uVar4 >> 0x10);
                auVar32._0_4_ = uVar4;
                auVar32._5_10_ = SUB1510(auVar96 << 0x30,5);
                auVar85._11_4_ = 0;
                auVar85._0_11_ = auVar32._4_11_;
                auVar36[2] = (char)((uint)uVar4 >> 8);
                auVar36._0_2_ = (ushort)uVar4;
                auVar36._3_12_ = SUB1512(auVar85 << 0x20,3);
                sVar111 = auVar144._0_2_;
                sVar114 = auVar144._2_2_;
                auVar11._8_6_ = 0;
                auVar11._0_8_ = uVar126;
                auVar11[0xe] = (char)((uint)uVar5 >> 0x18);
                auVar15._8_4_ = 0;
                auVar15._0_8_ = uVar126;
                auVar15[0xc] = (char)((uint)uVar5 >> 0x10);
                auVar15._13_2_ = auVar11._13_2_;
                auVar19._8_4_ = 0;
                auVar19._0_8_ = uVar126;
                auVar19._12_3_ = auVar15._12_3_;
                auVar23._8_2_ = 0;
                auVar23._0_8_ = uVar126;
                auVar23[10] = (char)((uint)uVar5 >> 8);
                auVar23._11_4_ = auVar19._11_4_;
                auVar27._8_2_ = 0;
                auVar27._0_8_ = uVar126;
                auVar27._10_5_ = auVar23._10_5_;
                auVar31[8] = (char)uVar5;
                auVar31._0_8_ = uVar126;
                auVar31._9_6_ = auVar27._9_6_;
                auVar86._7_8_ = 0;
                auVar86._0_7_ = auVar31._8_7_;
                Var71 = CONCAT81(SUB158(auVar86 << 0x40,7),(char)((uint)uVar6 >> 0x18));
                auVar97._9_6_ = 0;
                auVar97._0_9_ = Var71;
                auVar33[4] = (char)((uint)uVar6 >> 0x10);
                auVar33._0_4_ = uVar6;
                auVar33._5_10_ = SUB1510(auVar97 << 0x30,5);
                auVar87._11_4_ = 0;
                auVar87._0_11_ = auVar33._4_11_;
                auVar37[2] = (char)((uint)uVar6 >> 8);
                auVar37._0_2_ = (ushort)uVar6;
                auVar37._3_12_ = SUB1512(auVar87 << 0x20,3);
                sVar115 = auVar152._0_2_;
                sVar118 = auVar152._2_2_;
                uVar141 = CONCAT22(auVar37._2_2_ * sVar118 + auVar36._2_2_ * sVar114,
                                   ((ushort)uVar6 & 0xff) * sVar115 +
                                   ((ushort)uVar4 & 0xff) * sVar111);
                auVar142._0_8_ =
                     CONCAT26((short)Var71 * sVar118 + (short)Var67 * sVar114,
                              CONCAT24(auVar33._4_2_ * sVar115 + auVar32._4_2_ * sVar111,uVar141));
                auVar142._8_2_ = auVar31._8_2_ * sVar115 + auVar30._8_2_ * sVar111;
                auVar142._10_2_ = auVar23._10_2_ * sVar118 + auVar22._10_2_ * sVar114;
                auVar143._12_2_ = auVar15._12_2_ * sVar115 + auVar14._12_2_ * sVar111;
                auVar143._0_12_ = auVar142;
                auVar143._14_2_ = (auVar11._13_2_ >> 8) * sVar118 + (auVar10._13_2_ >> 8) * sVar114;
                auVar122._0_4_ = CONCAT22((short)uVar102,(short)(0x100 - uVar102));
                auVar122._4_4_ = auVar122._0_4_;
                auVar122._8_4_ = auVar122._0_4_;
                auVar122._12_4_ = auVar122._0_4_;
                auVar136._4_4_ = auVar142._8_4_;
                auVar136._0_4_ = uVar141;
                auVar136._8_4_ = (int)((ulong)auVar142._0_8_ >> 0x20);
                auVar136._12_4_ = auVar143._12_4_;
                auVar133 = pshuflw(auVar136,auVar136,0xd8);
                auVar133 = pshufhw(auVar133,auVar133,0xd8);
                auVar137._0_2_ = auVar133._0_2_ >> 8;
                auVar137._2_2_ = auVar133._2_2_ >> 8;
                auVar137._4_2_ = auVar133._4_2_ >> 8;
                auVar137._6_2_ = auVar133._6_2_ >> 8;
                auVar137._8_2_ = auVar133._8_2_ >> 8;
                auVar137._10_2_ = auVar133._10_2_ >> 8;
                auVar137._12_2_ = auVar133._12_2_ >> 8;
                auVar137._14_2_ = auVar133._14_2_ >> 8;
                auVar133 = pmaddwd(auVar137,auVar122);
                auVar138._0_4_ = auVar133._0_4_ >> 8;
                auVar138._4_4_ = auVar133._4_4_ >> 8;
                auVar138._8_4_ = auVar133._8_4_ >> 8;
                auVar138._12_4_ = auVar133._12_4_ >> 8;
                auVar133 = packssdw(auVar138,auVar138);
                sVar111 = auVar133._0_2_;
                sVar114 = auVar133._2_2_;
                sVar115 = auVar133._4_2_;
                sVar118 = auVar133._6_2_;
                *puVar107 = CONCAT13((0 < sVar118) * (sVar118 < 0x100) * auVar133[6] -
                                     (0xff < sVar118),
                                     CONCAT12((0 < sVar115) * (sVar115 < 0x100) * auVar133[4] -
                                              (0xff < sVar115),
                                              CONCAT11((0 < sVar114) * (sVar114 < 0x100) *
                                                       auVar133[2] - (0xff < sVar114),
                                                       (0 < sVar111) * (sVar111 < 0x100) *
                                                       auVar133[0] - (0xff < sVar111))));
                local_3c = local_3c + uVar103;
                puVar107 = puVar107 + 1;
              } while (puVar107 < puVar1);
            }
            goto LAB_00658fb5;
          }
          uVar102 = length + 1U >> 1;
          if (length < 0x400) {
            uVar102 = length;
          }
          (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_0)
                    (buffer,buffer + (int)uVar102,&data->field_23,&local_3c,&local_40,uVar103,0);
          puVar98 = buffer + (int)uVar102;
          if (uVar102 == length) goto LAB_00658fb5;
        }
        (*(code *)_ZL35bilinearFastTransformHelperARGB32PM_0)
                  (puVar98,puVar1,&data->field_23,&local_3c,&local_40,uVar103,0);
        goto LAB_00658fb5;
      }
    }
  }
  if (0 < length) {
    dVar2 = data->m13;
    dVar117 = data->m23 * dVar124 + dVar116 * dVar2 + data->m33;
    dVar125 = data->dx + data->m21 * dVar124 + dVar116 * dVar157;
    dVar116 = data->dy + data->m22 * dVar124 + dVar116 * dVar158;
    puVar7 = (data->field_23).texture.imageData;
    lVar105 = (data->field_23).texture.bytesPerLine;
    puVar98 = buffer;
    do {
      dVar124 = (double)(-(ulong)(dVar117 == 0.0) & 0x3ff0000000000000 |
                        ~-(ulong)(dVar117 == 0.0) & (ulong)(1.0 / dVar117));
      dVar140 = dVar124 * dVar125 + -0.5;
      dVar124 = dVar124 * dVar116 + -0.5;
      iVar119 = (data->field_23).texture.x1;
      iVar101 = (data->field_23).texture.y1;
      iVar146 = (int)dVar140 - (uint)(dVar140 < 0.0);
      iVar150 = (int)dVar124 - (uint)(dVar124 < 0.0);
      uVar3 = *(undefined8 *)((long)&data->field_23 + 0x18);
      iVar154 = (int)uVar3 + -1;
      iVar156 = (int)((ulong)uVar3 >> 0x20) + -1;
      auVar155._0_4_ = -(uint)(iVar146 < iVar154);
      auVar155._4_4_ = auVar155._0_4_;
      auVar155._8_4_ = -(uint)(iVar150 < iVar156);
      auVar155._12_4_ = -(uint)(iVar150 < iVar156);
      unaff_EBP = movmskpd(unaff_EBP,auVar155);
      iVar100 = iVar154;
      if (iVar146 < iVar154) {
        iVar100 = iVar146;
      }
      iVar106 = iVar146 + 1;
      if ((unaff_EBP & 1) == 0) {
        iVar106 = iVar154;
      }
      if (iVar146 < iVar119) {
        iVar106 = iVar119;
        iVar100 = iVar119;
      }
      iVar119 = iVar156;
      if (iVar150 < iVar156) {
        iVar119 = iVar150;
      }
      if ((unaff_EBP & 2) != 0) {
        iVar156 = iVar150 + 1;
      }
      if (iVar150 < iVar101) {
        iVar156 = iVar101;
        iVar119 = iVar101;
      }
      iVar101 = (int)((dVar140 - (double)iVar146) * 256.0);
      uVar103 = (uint)((dVar124 - (double)iVar150) * 256.0);
      lVar109 = iVar119 * lVar105;
      lVar108 = iVar156 * lVar105;
      uVar141 = *(undefined4 *)(puVar7 + (long)iVar106 * 4 + lVar109);
      uVar4 = *(undefined4 *)(puVar7 + (long)iVar100 * 4 + lVar109);
      uVar5 = *(undefined4 *)(puVar7 + (long)iVar106 * 4 + lVar108);
      uVar6 = *(undefined4 *)(puVar7 + (long)iVar100 * 4 + lVar108);
      uVar110 = CONCAT44(uVar141,uVar4);
      uVar126 = CONCAT44(uVar5,uVar6);
      bVar123 = (byte)((uint)uVar141 >> 0x18);
      auVar38._8_6_ = 0;
      auVar38._0_8_ = uVar110;
      auVar38[0xe] = bVar123;
      auVar42._8_4_ = 0;
      auVar42._0_8_ = uVar110;
      auVar42[0xc] = (char)((uint)uVar141 >> 0x10);
      auVar42._13_2_ = auVar38._13_2_;
      auVar46._8_4_ = 0;
      auVar46._0_8_ = uVar110;
      auVar46._12_3_ = auVar42._12_3_;
      auVar50._8_2_ = 0;
      auVar50._0_8_ = uVar110;
      auVar50[10] = (char)((uint)uVar141 >> 8);
      auVar50._11_4_ = auVar46._11_4_;
      auVar54._8_2_ = 0;
      auVar54._0_8_ = uVar110;
      auVar54._10_5_ = auVar50._10_5_;
      auVar58[8] = (char)uVar141;
      auVar58._0_8_ = uVar110;
      auVar58._9_6_ = auVar54._9_6_;
      auVar66._7_8_ = 0;
      auVar66._0_7_ = auVar58._8_7_;
      Var67 = CONCAT81(SUB158(auVar66 << 0x40,7),(char)((uint)uVar4 >> 0x18));
      auVar88._9_6_ = 0;
      auVar88._0_9_ = Var67;
      auVar62[4] = (char)((uint)uVar4 >> 0x10);
      auVar62._0_4_ = uVar4;
      auVar62._5_10_ = SUB1510(auVar88 << 0x30,5);
      auVar68._11_4_ = 0;
      auVar68._0_11_ = auVar62._4_11_;
      auVar69._1_12_ = SUB1512(auVar68 << 0x20,3);
      auVar69[0] = (char)((uint)uVar4 >> 8);
      auVar144 = pshuflw(ZEXT416(0x100 - uVar103),ZEXT416(0x100 - uVar103),0);
      bVar139 = (byte)((uint)uVar5 >> 0x18);
      auVar39._8_6_ = 0;
      auVar39._0_8_ = uVar126;
      auVar39[0xe] = bVar139;
      auVar43._8_4_ = 0;
      auVar43._0_8_ = uVar126;
      auVar43[0xc] = (char)((uint)uVar5 >> 0x10);
      auVar43._13_2_ = auVar39._13_2_;
      auVar47._8_4_ = 0;
      auVar47._0_8_ = uVar126;
      auVar47._12_3_ = auVar43._12_3_;
      auVar51._8_2_ = 0;
      auVar51._0_8_ = uVar126;
      auVar51[10] = (char)((uint)uVar5 >> 8);
      auVar51._11_4_ = auVar47._11_4_;
      auVar55._8_2_ = 0;
      auVar55._0_8_ = uVar126;
      auVar55._10_5_ = auVar51._10_5_;
      auVar59[8] = (char)uVar5;
      auVar59._0_8_ = uVar126;
      auVar59._9_6_ = auVar55._9_6_;
      auVar70._7_8_ = 0;
      auVar70._0_7_ = auVar59._8_7_;
      Var71 = CONCAT81(SUB158(auVar70 << 0x40,7),(char)((uint)uVar6 >> 0x18));
      auVar89._9_6_ = 0;
      auVar89._0_9_ = Var71;
      auVar63[4] = (char)((uint)uVar6 >> 0x10);
      auVar63._0_4_ = uVar6;
      auVar63._5_10_ = SUB1510(auVar89 << 0x30,5);
      auVar72._11_4_ = 0;
      auVar72._0_11_ = auVar63._4_11_;
      auVar73._1_12_ = SUB1512(auVar72 << 0x20,3);
      auVar73[0] = (char)((uint)uVar6 >> 8);
      auVar152 = pshuflw(ZEXT416(uVar103),ZEXT416(uVar103),0);
      sVar111 = auVar144._0_2_;
      sVar114 = auVar144._2_2_;
      sVar115 = auVar152._0_2_;
      sVar118 = auVar152._2_2_;
      uVar141 = CONCAT22(sVar118 * auVar73._0_2_ + sVar114 * auVar69._0_2_,
                         sVar115 * (ushort)(byte)uVar6 + sVar111 * (ushort)(byte)uVar4);
      auVar151._0_8_ =
           CONCAT26(sVar118 * (short)Var71 + sVar114 * (short)Var67,
                    CONCAT24(sVar115 * auVar63._4_2_ + sVar111 * auVar62._4_2_,uVar141));
      auVar151._8_2_ = sVar115 * auVar59._8_2_ + sVar111 * auVar58._8_2_;
      auVar151._10_2_ = sVar118 * auVar51._10_2_ + sVar114 * auVar50._10_2_;
      auVar153._12_2_ = sVar115 * auVar43._12_2_ + sVar111 * auVar42._12_2_;
      auVar153._0_12_ = auVar151;
      auVar153._14_2_ = sVar118 * (ushort)bVar139 + sVar114 * (ushort)bVar123;
      auVar145._0_4_ = CONCAT22((short)iVar101,(short)(0x100 - iVar101));
      auVar145._4_4_ = auVar145._0_4_;
      auVar145._8_4_ = auVar145._0_4_;
      auVar145._12_4_ = auVar145._0_4_;
      auVar147._4_4_ = auVar151._8_4_;
      auVar147._0_4_ = uVar141;
      auVar147._8_4_ = (int)((ulong)auVar151._0_8_ >> 0x20);
      auVar147._12_4_ = auVar153._12_4_;
      auVar144 = pshuflw(auVar147,auVar147,0xd8);
      auVar144 = pshufhw(auVar144,auVar144,0xd8);
      auVar148._0_2_ = auVar144._0_2_ >> 8;
      auVar148._2_2_ = auVar144._2_2_ >> 8;
      auVar148._4_2_ = auVar144._4_2_ >> 8;
      auVar148._6_2_ = auVar144._6_2_ >> 8;
      auVar148._8_2_ = auVar144._8_2_ >> 8;
      auVar148._10_2_ = auVar144._10_2_ >> 8;
      auVar148._12_2_ = auVar144._12_2_ >> 8;
      auVar148._14_2_ = auVar144._14_2_ >> 8;
      auVar144 = pmaddwd(auVar148,auVar145);
      auVar149._0_4_ = auVar144._0_4_ >> 8;
      auVar149._4_4_ = auVar144._4_4_ >> 8;
      auVar149._8_4_ = auVar144._8_4_ >> 8;
      auVar149._12_4_ = auVar144._12_4_ >> 8;
      dVar125 = dVar125 + dVar157;
      dVar116 = dVar116 + dVar158;
      auVar144 = packssdw(auVar149,auVar149);
      dVar117 = dVar117 + dVar2;
      sVar111 = auVar144._0_2_;
      sVar114 = auVar144._2_2_;
      sVar115 = auVar144._4_2_;
      sVar118 = auVar144._6_2_;
      *puVar98 = CONCAT13((0 < sVar118) * (sVar118 < 0x100) * auVar144[6] - (0xff < sVar118),
                          CONCAT12((0 < sVar115) * (sVar115 < 0x100) * auVar144[4] -
                                   (0xff < sVar115),
                                   CONCAT11((0 < sVar114) * (sVar114 < 0x100) * auVar144[2] -
                                            (0xff < sVar114),
                                            (0 < sVar111) * (sVar111 < 0x100) * auVar144[0] -
                                            (0xff < sVar111))));
      dVar117 = (double)((ulong)dVar117 & -(ulong)(dVar117 != 0.0) |
                        ~-(ulong)(dVar117 != 0.0) & (ulong)(dVar2 + dVar117));
      puVar98 = puVar98 + 1;
    } while (puVar98 < puVar1);
  }
LAB_00658fb5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return buffer;
  }
  __stack_chk_fail();
}

Assistant:

static const uint * QT_FASTCALL fetchTransformedBilinearARGB32PM(uint *buffer, const Operator *,
                                                                 const QSpanData *data, int y, int x,
                                                                 int length)
{
    const qreal cx = x + qreal(0.5);
    const qreal cy = y + qreal(0.5);
    constexpr int tiled = (blendType == BlendTransformedBilinearTiled) ? 1 : 0;

    uint *end = buffer + length;
    uint *b = buffer;
    if (canUseFastMatrixPath(cx, cy, length, data)) {
        // The increment pr x in the scanline
        int fdx = (int)(data->m11 * fixed_scale);
        int fdy = (int)(data->m12 * fixed_scale);

        int fx = int((data->m21 * cy
                      + data->m11 * cx + data->dx) * fixed_scale);
        int fy = int((data->m22 * cy
                      + data->m12 * cx + data->dy) * fixed_scale);

        fx -= half_point;
        fy -= half_point;

        if (fdy == 0) { // simple scale, no rotation or shear
            if (qAbs(fdx) <= fixed_scale) {
                // simple scale up on X
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(fdx) <= 2 * fixed_scale) {
                // simple scale down on X, less than 2x
                const int mid = (length * 2 < BufferSize) ? length : ((length + 1) / 2);
                bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer, buffer + mid, data->texture, fx, fy, fdx, fdy);
                if (mid != length)
                    bilinearFastTransformHelperARGB32PM[tiled][SimpleScaleTransform](buffer + mid, buffer + length, data->texture, fx, fy, fdx, fdy);
            } else if (qAbs(data->m22) < qreal(1./8.)) {
                // scale up more than 8x (on Y)
                bilinearFastTransformHelperARGB32PM[tiled][UpscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // scale down on X
                bilinearFastTransformHelperARGB32PM[tiled][DownscaleTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        } else { // rotation or shear
            if (qAbs(data->m11) < qreal(1./8.) || qAbs(data->m22) < qreal(1./8.) ) {
                // if we are zooming more than 8 times, we use 8bit precision for the position.
                bilinearFastTransformHelperARGB32PM[tiled][RotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            } else {
                // we are zooming less than 8x, use 4bit precision
                bilinearFastTransformHelperARGB32PM[tiled][FastRotateTransform](b, end, data->texture, fx, fy, fdx, fdy);
            }
        }
    } else {
        const QTextureData &image = data->texture;

        const qreal fdx = data->m11;
        const qreal fdy = data->m12;
        const qreal fdw = data->m13;

        qreal fx = data->m21 * cy + data->m11 * cx + data->dx;
        qreal fy = data->m22 * cy + data->m12 * cx + data->dy;
        qreal fw = data->m23 * cy + data->m13 * cx + data->m33;

        while (b < end) {
            const qreal iw = fw == 0 ? 1 : 1 / fw;
            const qreal px = fx * iw - qreal(0.5);
            const qreal py = fy * iw - qreal(0.5);

            int x1 = int(px) - (px < 0);
            int x2;
            int y1 = int(py) - (py < 0);
            int y2;

            int distx = int((px - x1) * 256);
            int disty = int((py - y1) * 256);

            fetchTransformedBilinear_pixelBounds<blendType>(image.width, image.x1, image.x2 - 1, x1, x2);
            fetchTransformedBilinear_pixelBounds<blendType>(image.height, image.y1, image.y2 - 1, y1, y2);

            const uint *s1 = (const uint *)data->texture.scanLine(y1);
            const uint *s2 = (const uint *)data->texture.scanLine(y2);

            uint tl = s1[x1];
            uint tr = s1[x2];
            uint bl = s2[x1];
            uint br = s2[x2];

            *b = interpolate_4_pixels(tl, tr, bl, br, distx, disty);

            fx += fdx;
            fy += fdy;
            fw += fdw;
            //force increment to avoid /0
            if (!fw) {
                fw += fdw;
            }
            ++b;
        }
    }

    return buffer;
}